

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

bool duckdb::AllowCommunityExtensionsSetting::OnGlobalSet
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  bool bVar1;
  InvalidInputException *this;
  string local_40;
  
  bVar1 = true;
  if ((db != (DatabaseInstance *)0x0) && ((config->options).allow_community_extensions == false)) {
    bVar1 = Value::GetValue<bool>(input);
    if (bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Cannot upgrade allow_community_extensions setting while database is running","");
      InvalidInputException::InvalidInputException(this,&local_40);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AllowCommunityExtensionsSetting::OnGlobalSet(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (db && !config.options.allow_community_extensions) {
		auto new_value = input.GetValue<bool>();
		if (new_value) {
			throw InvalidInputException("Cannot upgrade allow_community_extensions setting while database is running");
		}
		return false;
	}
	return true;
}